

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_do_edit(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_flags flags,
                   nk_plugin_filter filter,nk_text_edit *edit,nk_style_edit *style,nk_input *in,
                   nk_user_font *font)

{
  float fVar1;
  uchar uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_rect rect;
  nk_rect b_00;
  nk_rect rect_00;
  nk_rect scroll_00;
  nk_rect r;
  nk_rect rect_01;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  float fVar11;
  float y0;
  float fVar12;
  float local_2f0;
  float local_2ec;
  float local_2e8;
  float local_2e4;
  int local_2e0;
  float local_2d8;
  float local_2d4;
  float local_2cc;
  int local_2c8;
  bool local_2be;
  bool local_2bd;
  float local_2bc;
  float local_2b8;
  nk_color local_2b0;
  nk_color local_2ac;
  nk_color text_color_1;
  nk_color background_color_1;
  nk_style_item *background_2;
  char *begin_5;
  int l_1;
  nk_rune local_28c;
  undefined1 auStack_288 [4];
  nk_rune unicode_2;
  nk_text txt;
  nk_rect label;
  int glyph_len_2;
  nk_rect cursor;
  char *end_1;
  char *begin_4;
  char *begin_3;
  char *begin_2;
  int l;
  char *begin_1;
  nk_style_edit *local_218;
  nk_style_item *background_1;
  nk_color cursor_text_color;
  nk_color cursor_color;
  nk_color sel_text_color;
  nk_color sel_background_color;
  nk_color text_color;
  nk_color background_color;
  float scroll_inc;
  float scroll_step;
  float scroll_offset;
  float scroll_target;
  nk_rect scroll;
  nk_flags ws;
  float scroll_increment;
  char *local_1c8;
  char *remaining_2;
  nk_vec2 row_size_2;
  nk_vec2 out_offset_2;
  int glyph_offset_2;
  char *local_1a0;
  char *remaining_1;
  nk_vec2 row_size_1;
  nk_vec2 out_offset_1;
  int glyph_offset_1;
  char *local_178;
  char *remaining;
  nk_vec2 row_size;
  nk_vec2 out_offset;
  int glyph_offset;
  int row_begin;
  int glyphs;
  int text_len;
  nk_rune unicode_1;
  int glyph_len_1;
  float glyph_width;
  float line_width;
  int selection_end;
  int selection_begin;
  nk_vec2 selection_offset_end;
  nk_vec2 selection_offset_start;
  nk_vec2 cursor_pos;
  char *select_end_ptr;
  char *select_begin_ptr;
  char *cursor_ptr;
  float fStack_100;
  nk_vec2 text_size;
  int total_lines;
  nk_style_item *background;
  int len;
  char *text_1;
  int tab;
  int paste;
  int end;
  int begin;
  int e;
  int b;
  char *text;
  nk_rune unicode;
  int glyph_len;
  int cut;
  int copy;
  int old_mode;
  int i;
  float mouse_y;
  float mouse_x;
  int shift_mod;
  nk_text_edit_type type;
  nk_rect clip;
  nk_rect old_clip;
  char local_6a;
  char cursor_follow;
  char select_all;
  char is_hovered;
  char prev_state;
  float row_height;
  nk_flags ret;
  nk_rect area;
  nk_style_edit *style_local;
  nk_text_edit *edit_local;
  nk_plugin_filter filter_local;
  nk_flags flags_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  float fStack_18;
  nk_rect bounds_local;
  
  state_local._4_4_ = bounds.x;
  fStack_18 = bounds.y;
  bounds_local.x = bounds.w;
  bounds_local.y = bounds.h;
  bVar10 = false;
  bVar5 = false;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5966,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5967,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_edit *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5968,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (((state == (nk_flags *)0x0) || (out == (nk_command_buffer *)0x0)) ||
     (style == (nk_style_edit *)0x0)) {
    bounds_local.w = 0.0;
  }
  else {
    fVar11 = state_local._4_4_ + (style->padding).x + style->border;
    y0 = fStack_18 + (style->padding).y + style->border;
    fVar12 = (style->padding).x;
    area.x = bounds_local.x - (fVar12 + fVar12 + style->border * 2.0);
    fVar12 = (style->padding).y;
    fVar12 = bounds_local.y - (fVar12 + fVar12 + style->border * 2.0);
    if ((flags & 0x400) != 0) {
      if (area.x - (style->scrollbar_size).x <= 0.0) {
        local_2b8 = 0.0;
      }
      else {
        local_2b8 = area.x - (style->scrollbar_size).x;
      }
      area.x = local_2b8;
    }
    local_2bc = fVar12;
    if ((flags & 0x400) != 0) {
      local_2bc = font->height + style->row_padding;
    }
    clip.w = (out->clip).x;
    clip.h = (out->clip).y;
    uVar3 = (out->clip).w;
    uVar4 = (out->clip).h;
    r.h = (float)uVar4;
    r.w = (float)uVar3;
    nk_unify((nk_rect *)&shift_mod,(nk_rect *)&clip.w,fVar11,y0,fVar11 + area.x,y0 + fVar12);
    uVar2 = edit->active;
    iVar6 = nk_input_is_mouse_hovering_rect(in,bounds);
    local_6a = (char)iVar6;
    if (((in != (nk_input *)0x0) && ((in->mouse).buttons[0].clicked != 0)) &&
       ((in->mouse).buttons[0].down != 0)) {
      local_2bd = false;
      if ((state_local._4_4_ <= (in->mouse).pos.x) &&
         (local_2bd = false, (in->mouse).pos.x < state_local._4_4_ + bounds_local.x)) {
        local_2be = false;
        if (fStack_18 <= (in->mouse).pos.y) {
          local_2be = (in->mouse).pos.y < fStack_18 + bounds_local.y;
        }
        local_2bd = local_2be;
      }
      edit->active = local_2bd;
    }
    if ((uVar2 == '\0') && (edit->active != '\0')) {
      mouse_x = (float)(uint)((flags & 0x400) != 0);
      nk_textedit_clear_state(edit,(nk_text_edit_type)mouse_x,filter);
      bVar10 = (flags & 2) != 0;
      if ((flags & 0x800) != 0) {
        edit->cursor = (edit->string).len;
        in = (nk_input *)0x0;
      }
    }
    else if (edit->active == '\0') {
      edit->mode = '\0';
    }
    if ((flags & 1) == 0) {
      if ((flags & 0x200) != 0) {
        edit->mode = '\x01';
      }
    }
    else {
      edit->mode = '\0';
    }
    _cursor_follow = 2.8026e-45;
    if (edit->active != '\0') {
      _cursor_follow = 1.4013e-45;
    }
    if ((int)(char)uVar2 != (uint)edit->active) {
      uVar7 = 8;
      if (edit->active != '\0') {
        uVar7 = 4;
      }
      _cursor_follow = (float)(uVar7 | (uint)_cursor_follow);
    }
    if ((edit->active != '\0') && (in != (nk_input *)0x0)) {
      mouse_y = (float)(in->keyboard).keys[1].down;
      i = (int)(((in->mouse).pos.x - fVar11) + (edit->scrollbar).x);
      old_mode = (int)(((in->mouse).pos.y - y0) + (edit->scrollbar).y);
      rect_01.y = y0;
      rect_01.x = fVar11;
      rect_01.w = area.x;
      rect_01.h = fVar12;
      iVar6 = nk_input_is_mouse_hovering_rect(in,rect_01);
      local_6a = (char)iVar6;
      if (bVar10) {
        nk_textedit_select_all(edit);
      }
      else if (((local_6a == '\0') || ((in->mouse).buttons[0].down == 0)) ||
              ((in->mouse).buttons[0].clicked == 0)) {
        if (((local_6a == '\0') || ((in->mouse).buttons[0].down == 0)) ||
           (((fVar1 = (in->mouse).delta.x, fVar1 == 0.0 &&
             ((!NAN(fVar1) && (fVar1 = (in->mouse).delta.y, fVar1 == 0.0)))) && (!NAN(fVar1))))) {
          if (((local_6a != '\0') && ((in->mouse).buttons[2].clicked != 0)) &&
             ((in->mouse).buttons[2].down != 0)) {
            nk_textedit_key(edit,NK_KEY_TEXT_WORD_LEFT,0,font,local_2bc);
            nk_textedit_key(edit,NK_KEY_TEXT_WORD_RIGHT,1,font,local_2bc);
            bVar5 = true;
          }
        }
        else {
          nk_textedit_drag(edit,(float)i,(float)old_mode,font,local_2bc);
          bVar5 = true;
        }
      }
      else {
        nk_textedit_click(edit,(float)i,(float)old_mode,font,local_2bc);
      }
      cut = (int)edit->mode;
      for (copy = 0; copy < 0x1e; copy = copy + 1) {
        if (((copy != 4) && (copy != 5)) && (iVar6 = nk_input_is_key_pressed(in,copy), iVar6 != 0))
        {
          nk_textedit_key(edit,copy,(int)mouse_y,font,local_2bc);
          bVar5 = true;
        }
      }
      if (cut != (uint)edit->mode) {
        (in->keyboard).text_len = 0;
      }
      edit->filter = filter;
      if ((in->keyboard).text_len != 0) {
        nk_textedit_text(edit,(in->keyboard).text,(in->keyboard).text_len);
        bVar5 = true;
        (in->keyboard).text_len = 0;
      }
      iVar6 = nk_input_is_key_pressed(in,NK_KEY_ENTER);
      if (iVar6 != 0) {
        bVar5 = true;
        if (((flags & 0x80) == 0) || (mouse_y == 0.0)) {
          if ((flags & 4) == 0) {
            nk_textedit_text(edit,"\n",1);
          }
          else {
            _cursor_follow = (float)((uint)_cursor_follow | 0x10);
          }
        }
        else {
          nk_textedit_text(edit,"\n",1);
        }
      }
      glyph_len = nk_input_is_key_pressed(in,NK_KEY_COPY);
      unicode = nk_input_is_key_pressed(in,NK_KEY_CUT);
      if (((glyph_len != 0) || (unicode != 0)) && ((flags & 0x40) != 0)) {
        iVar6 = edit->select_start;
        iVar8 = edit->select_end;
        local_2c8 = iVar6;
        if (iVar6 < iVar8) {
          local_2c8 = iVar8;
          iVar8 = iVar6;
        }
        pcVar9 = nk_str_at_const(&edit->string,iVar8,(nk_rune *)&text,(int *)((long)&text + 4));
        if ((edit->clip).copy != (nk_plugin_copy)0x0) {
          (*(edit->clip).copy)((edit->clip).userdata,pcVar9,local_2c8 - iVar8);
        }
        if ((unicode != 0) && ((flags & 1) == 0)) {
          nk_textedit_cut(edit);
          bVar5 = true;
        }
      }
      iVar6 = nk_input_is_key_pressed(in,NK_KEY_PASTE);
      if (((iVar6 != 0) && ((flags & 0x40) != 0)) && ((edit->clip).paste != (nk_plugin_paste)0x0)) {
        (*(edit->clip).paste)((edit->clip).userdata,edit);
        bVar5 = true;
      }
      iVar6 = nk_input_is_key_pressed(in,NK_KEY_TAB);
      if ((iVar6 != 0) && ((flags & 8) != 0)) {
        nk_textedit_text(edit,"    ",4);
        bVar5 = true;
      }
    }
    if (edit->active == '\0') {
      if ((*state & 2) == 0) {
        *state = 4;
      }
      else {
        *state = 6;
      }
    }
    else {
      *state = 0x22;
    }
    if (local_6a != '\0') {
      *state = *state | 0x12;
    }
    pcVar9 = nk_str_get_const(&edit->string);
    iVar6 = nk_str_len_char(&edit->string);
    if ((*state & 0x20) == 0) {
      unique0x10001a57 = style;
      if ((*state & 0x10) != 0) {
        register0x00000000 = (nk_style_edit *)&style->hover;
      }
    }
    else {
      register0x00000000 = (nk_style_edit *)&style->active;
    }
    if ((stack0xffffffffffffff08->normal).type == NK_STYLE_ITEM_COLOR) {
      nk_stroke_rect(out,bounds,style->rounding,style->border,style->border_color);
      nk_fill_rect(out,bounds,style->rounding,(stack0xffffffffffffff08->normal).data.color);
    }
    else {
      nk_draw_image(out,bounds,&(stack0xffffffffffffff08->normal).data.image,(nk_color)0xffffffff);
    }
    if (area.x - style->cursor_size <= 0.0) {
      local_2cc = 0.0;
    }
    else {
      local_2cc = area.x - style->cursor_size;
    }
    if (edit->active == '\0') {
      iVar6 = nk_str_len_char(&edit->string);
      pcVar9 = nk_str_get_const(&edit->string);
      nk_push_scissor(out,_shift_mod);
      if ((*state & 0x20) == 0) {
        if ((*state & 0x10) == 0) {
          local_2b0 = style->text_normal;
          _text_color_1 = style;
        }
        else {
          _text_color_1 = (nk_style_edit *)&style->hover;
          local_2b0 = style->text_hover;
        }
      }
      else {
        _text_color_1 = (nk_style_edit *)&style->active;
        local_2b0 = style->text_active;
      }
      if ((_text_color_1->normal).type == NK_STYLE_ITEM_IMAGE) {
        local_2ac = nk_rgba(0,0,0,0);
      }
      else {
        local_2ac = (_text_color_1->normal).data.color;
      }
      nk_edit_draw_text(out,style,fVar11 - (edit->scrollbar).x,y0 - (edit->scrollbar).y,0.0,pcVar9,
                        iVar6,local_2bc,font,local_2ac,local_2b0,0);
    }
    else {
      text_size.x = 1.4013e-45;
      unique0x10000448 = nk_vec2(0.0,0.0);
      select_begin_ptr = (char *)0x0;
      select_end_ptr = (char *)0x0;
      cursor_pos.x = 0.0;
      cursor_pos.y = 0.0;
      selection_offset_start = nk_vec2(0.0,0.0);
      selection_offset_end = nk_vec2(0.0,0.0);
      _selection_end = nk_vec2(0.0,0.0);
      if (edit->select_start < edit->select_end) {
        local_2d4 = (float)edit->select_start;
      }
      else {
        local_2d4 = (float)edit->select_end;
      }
      line_width = local_2d4;
      if (edit->select_start < edit->select_end) {
        local_2d8 = (float)edit->select_end;
      }
      else {
        local_2d8 = (float)edit->select_start;
      }
      glyph_width = local_2d8;
      glyph_len_1 = 0;
      if ((pcVar9 != (char *)0x0) && (iVar6 != 0)) {
        text_len = 0;
        glyphs = 0;
        row_begin = 0;
        glyph_offset = 0;
        out_offset.y = 0.0;
        text_len = nk_utf_decode(pcVar9,(nk_rune *)&glyphs,iVar6);
        unicode_1 = (nk_rune)(*font->width)(font->userdata,font->height,pcVar9,text_len);
        glyph_len_1 = 0;
        while (row_begin < iVar6 && text_len != 0) {
          if ((select_begin_ptr == (char *)0x0) && (glyph_offset == edit->cursor)) {
            unique0x10000468 =
                 nk_text_calculate_text_bounds
                           (font,pcVar9 + (int)out_offset.y,row_begin - (int)out_offset.y,local_2bc,
                            &local_178,&row_size,(int *)&out_offset,1);
            remaining._0_4_ = out_offset_1.y;
            selection_offset_start.y = (float)((int)text_size.x + -1) * local_2bc;
            selection_offset_start.x = remaining._0_4_;
            select_begin_ptr = pcVar9 + row_begin;
            remaining = (char *)unique0x10000468;
          }
          if (((select_end_ptr == (char *)0x0) && (edit->select_start != edit->select_end)) &&
             ((float)glyph_offset == line_width)) {
            if ((int)text_size.x + -1 < 0) {
              local_2e0 = 0;
            }
            else {
              local_2e0 = (int)text_size.x + -1;
            }
            selection_offset_end.y = (float)local_2e0 * local_2bc;
            unique0x10000470 =
                 nk_text_calculate_text_bounds
                           (font,pcVar9 + (int)out_offset.y,row_begin - (int)out_offset.y,local_2bc,
                            &local_1a0,&row_size_1,(int *)&out_offset_1,1);
            remaining_1._4_4_ = out_offset_2.y;
            selection_offset_end.x = remaining_1._4_4_;
            select_end_ptr = pcVar9 + row_begin;
            unique0x10001a43 = unique0x10000470;
          }
          if (((cursor_pos == (nk_vec2)0x0) && (edit->select_start != edit->select_end)) &&
             ((float)glyph_offset == glyph_width)) {
            selection_begin = (int)((float)((int)text_size.x + -1) * local_2bc);
            unique0x10000478 =
                 nk_text_calculate_text_bounds
                           (font,pcVar9 + (int)out_offset.y,row_begin - (int)out_offset.y,local_2bc,
                            &local_1c8,&row_size_2,(int *)&out_offset_2,1);
            selection_end = (int)remaining_2._4_4_;
            cursor_pos = (nk_vec2)((long)pcVar9 + (long)row_begin);
          }
          if (glyphs == 10) {
            if ((float)glyph_len_1 <= cursor_ptr._4_4_) {
              local_2e4 = cursor_ptr._4_4_;
            }
            else {
              local_2e4 = (float)glyph_len_1;
            }
            fStack_100 = 0.0;
            cursor_ptr._4_4_ = local_2e4;
            text_size.x = (float)((int)text_size.x + 1);
            glyph_len_1 = 0;
            row_begin = row_begin + 1;
            glyph_offset = glyph_offset + 1;
            out_offset.y = (float)row_begin;
            text_len = nk_utf_decode(pcVar9 + row_begin,(nk_rune *)&glyphs,iVar6 - row_begin);
            unicode_1 = (nk_rune)(*font->width)(font->userdata,font->height,pcVar9 + row_begin,
                                                text_len);
          }
          else {
            glyph_offset = glyph_offset + 1;
            row_begin = text_len + row_begin;
            glyph_len_1 = (int)((float)unicode_1 + (float)glyph_len_1);
            text_len = nk_utf_decode(pcVar9 + row_begin,(nk_rune *)&glyphs,iVar6 - row_begin);
            unicode_1 = (nk_rune)(*font->width)(font->userdata,font->height,pcVar9 + row_begin,
                                                text_len);
          }
        }
        fStack_100 = (float)(int)text_size.x * local_2bc;
        if ((select_begin_ptr == (char *)0x0) && (edit->cursor == (edit->string).len)) {
          selection_offset_start.y = (float)(int)text_size.x * local_2bc - local_2bc;
          selection_offset_start.x = (float)glyph_len_1;
        }
      }
      if (bVar5) {
        if ((flags & 0x100) == 0) {
          scroll.h = local_2cc * 0.25;
          if (selection_offset_start.x < (edit->scrollbar).x) {
            if (selection_offset_start.x - scroll.h <= 0.0) {
              local_2e8 = 0.0;
            }
            else {
              local_2e8 = selection_offset_start.x - scroll.h;
            }
            (edit->scrollbar).x = (float)(int)local_2e8;
          }
          if ((edit->scrollbar).x + local_2cc <= selection_offset_start.x) {
            if ((edit->scrollbar).x + scroll.h <= 0.0) {
              local_2ec = 0.0;
            }
            else {
              local_2ec = (edit->scrollbar).x + scroll.h;
            }
            (edit->scrollbar).x = (float)(int)local_2ec;
          }
        }
        else {
          (edit->scrollbar).x = 0.0;
        }
        if ((flags & 0x400) == 0) {
          (edit->scrollbar).y = 0.0;
        }
        else {
          if (selection_offset_start.y < (edit->scrollbar).y) {
            if (selection_offset_start.y - local_2bc <= 0.0) {
              local_2f0 = 0.0;
            }
            else {
              local_2f0 = selection_offset_start.y - local_2bc;
            }
            (edit->scrollbar).y = local_2f0;
          }
          if ((edit->scrollbar).y + fVar12 <= selection_offset_start.y) {
            (edit->scrollbar).y = (edit->scrollbar).y + local_2bc;
          }
        }
      }
      if ((flags & 0x400) != 0) {
        scroll.x = (style->scrollbar_size).x;
        scroll_00.y = y0;
        scroll_00.x = ((state_local._4_4_ + bounds_local.x) - style->border) -
                      (style->scrollbar_size).x;
        scroll_00.w = scroll.x;
        scroll_00.h = fVar12;
        scroll.y = fVar12;
        fVar12 = nk_do_scrollbarv((nk_flags *)&scroll.w,out,scroll_00,0,(edit->scrollbar).y,
                                  fStack_100,fVar12 * 0.1,fVar12 * 0.01,&style->scrollbar,in,font);
        (edit->scrollbar).y = fVar12;
      }
      nk_push_scissor(out,_shift_mod);
      if ((*state & 0x20) == 0) {
        if ((*state & 0x10) == 0) {
          sel_text_color = style->text_normal;
          cursor_text_color = style->selected_text_normal;
          cursor_color = style->selected_normal;
          background_1._4_4_ = style->cursor_normal;
          background_1._0_4_ = style->cursor_text_normal;
          local_218 = style;
        }
        else {
          local_218 = (nk_style_edit *)&style->hover;
          sel_text_color = style->text_hover;
          cursor_text_color = style->selected_text_hover;
          cursor_color = style->selected_hover;
          background_1._0_4_ = style->cursor_text_hover;
          background_1._4_4_ = style->cursor_hover;
        }
      }
      else {
        local_218 = (nk_style_edit *)&style->active;
        sel_text_color = style->text_active;
        cursor_text_color = style->selected_text_hover;
        cursor_color = style->selected_hover;
        background_1._4_4_ = style->cursor_hover;
        background_1._0_4_ = style->cursor_text_hover;
      }
      if ((local_218->normal).type == NK_STYLE_ITEM_IMAGE) {
        sel_background_color = nk_rgba(0,0,0,0);
      }
      else {
        sel_background_color = (local_218->normal).data.color;
      }
      if (edit->select_start == edit->select_end) {
        pcVar9 = nk_str_get_const(&edit->string);
        iVar6 = nk_str_len_char(&edit->string);
        nk_edit_draw_text(out,style,fVar11 - (edit->scrollbar).x,y0 - (edit->scrollbar).y,0.0,pcVar9
                          ,iVar6,local_2bc,font,sel_background_color,sel_text_color,0);
      }
      else {
        if ((edit->select_start != edit->select_end) && (0 < (int)line_width)) {
          pcVar9 = nk_str_get_const(&edit->string);
          if (select_end_ptr == (char *)0x0) {
            __assert_fail("select_begin_ptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                          ,0x5ae5,
                          "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                         );
          }
          nk_edit_draw_text(out,style,fVar11 - (edit->scrollbar).x,y0 - (edit->scrollbar).y,0.0,
                            pcVar9,(int)select_end_ptr - (int)pcVar9,local_2bc,font,
                            sel_background_color,sel_text_color,0);
        }
        if (edit->select_start != edit->select_end) {
          if (select_end_ptr == (char *)0x0) {
            __assert_fail("select_begin_ptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                          ,0x5aec,
                          "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                         );
          }
          if (cursor_pos == (nk_vec2)0x0) {
            pcVar9 = nk_str_get_const(&edit->string);
            iVar6 = nk_str_len_char(&edit->string);
            cursor_pos = (nk_vec2)((long)pcVar9 + (long)iVar6);
          }
          nk_edit_draw_text(out,style,fVar11 - (edit->scrollbar).x,
                            (y0 + selection_offset_end.y) - (edit->scrollbar).y,
                            selection_offset_end.x,select_end_ptr,
                            (int)cursor_pos.x - (int)select_end_ptr,local_2bc,font,cursor_color,
                            cursor_text_color,1);
        }
        if ((edit->select_start != edit->select_end) && ((int)glyph_width < (edit->string).len)) {
          pcVar9 = nk_str_get_const(&edit->string);
          iVar6 = nk_str_len_char(&edit->string);
          if (cursor_pos == (nk_vec2)0x0) {
            __assert_fail("select_end_ptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                          ,0x5aff,
                          "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                         );
          }
          nk_edit_draw_text(out,style,fVar11 - (edit->scrollbar).x,
                            (y0 + (float)selection_begin) - (edit->scrollbar).y,(float)selection_end
                            ,(char *)cursor_pos,((int)pcVar9 + iVar6) - (int)cursor_pos.x,local_2bc,
                            font,sel_background_color,sel_text_color,1);
        }
      }
      if (edit->select_start == edit->select_end) {
        iVar6 = edit->cursor;
        iVar8 = nk_str_len(&edit->string);
        if ((iVar6 < iVar8) && ((select_begin_ptr == (char *)0x0 || (*select_begin_ptr != '\n')))) {
          if (select_begin_ptr == (char *)0x0) {
            __assert_fail("cursor_ptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                          ,0x5b1d,
                          "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                         );
          }
          iVar6 = nk_utf_decode(select_begin_ptr,&local_28c,4);
          txt.text = (nk_color)((fVar11 + selection_offset_start.x) - (edit->scrollbar).x);
          fVar12 = (y0 + selection_offset_start.y) - (edit->scrollbar).y;
          fVar11 = (*font->width)(font->userdata,font->height,select_begin_ptr,iVar6);
          _auStack_288 = nk_vec2(0.0,0.0);
          txt.padding.x = (float)background_1._4_4_;
          txt.padding.y = (float)background_1._0_4_;
          rect.y = fVar12;
          rect.x = (float)txt.text;
          rect.w = fVar11;
          rect.h = local_2bc;
          nk_fill_rect(out,rect,0.0,background_1._4_4_);
          b_00.y = fVar12;
          b_00.x = (float)txt.text;
          b_00.w = fVar11;
          b_00.h = local_2bc;
          nk_widget_text(out,b_00,select_begin_ptr,iVar6,(nk_text *)auStack_288,0x11,font);
        }
        else {
          rect_00.y = (y0 + selection_offset_start.y + local_2bc * 0.5 + font->height * -0.5) -
                      (edit->scrollbar).y;
          rect_00.x = (fVar11 + selection_offset_start.x) - (edit->scrollbar).x;
          rect_00.w = style->cursor_size;
          rect_00.h = font->height;
          nk_fill_rect(out,rect_00,0.0,background_1._4_4_);
        }
      }
    }
    r.x = clip.w;
    r.y = clip.h;
    nk_push_scissor(out,r);
    bounds_local.w = _cursor_follow;
  }
  return (nk_flags)bounds_local.w;
}

Assistant:

NK_LIB nk_flags
nk_do_edit(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, nk_flags flags, nk_plugin_filter filter,
    struct nk_text_edit *edit, const struct nk_style_edit *style,
    struct nk_input *in, const struct nk_user_font *font)
{
    struct nk_rect area;
    nk_flags ret = 0;
    float row_height;
    char prev_state = 0;
    char is_hovered = 0;
    char select_all = 0;
    char cursor_follow = 0;
    struct nk_rect old_clip;
    struct nk_rect clip;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(style);
    if (!state || !out || !style)
        return ret;

    /* visible text area calculation */
    area.x = bounds.x + style->padding.x + style->border;
    area.y = bounds.y + style->padding.y + style->border;
    area.w = bounds.w - (2.0f * style->padding.x + 2 * style->border);
    area.h = bounds.h - (2.0f * style->padding.y + 2 * style->border);
    if (flags & NK_EDIT_MULTILINE)
        area.w = NK_MAX(0, area.w - style->scrollbar_size.x);
    row_height = (flags & NK_EDIT_MULTILINE)? font->height + style->row_padding: area.h;

    /* calculate clipping rectangle */
    old_clip = out->clip;
    nk_unify(&clip, &old_clip, area.x, area.y, area.x + area.w, area.y + area.h);

    /* update edit state */
    prev_state = (char)edit->active;
    is_hovered = (char)nk_input_is_mouse_hovering_rect(in, bounds);
    if (in && in->mouse.buttons[NK_BUTTON_LEFT].clicked && in->mouse.buttons[NK_BUTTON_LEFT].down) {
        edit->active = NK_INBOX(in->mouse.pos.x, in->mouse.pos.y,
                                bounds.x, bounds.y, bounds.w, bounds.h);
    }

    /* (de)activate text editor */
    if (!prev_state && edit->active) {
        const enum nk_text_edit_type type = (flags & NK_EDIT_MULTILINE) ?
            NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE;
        nk_textedit_clear_state(edit, type, filter);
        if (flags & NK_EDIT_AUTO_SELECT)
            select_all = nk_true;
        if (flags & NK_EDIT_GOTO_END_ON_ACTIVATE) {
            edit->cursor = edit->string.len;
            in = 0;
        }
    } else if (!edit->active) edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    if (flags & NK_EDIT_READ_ONLY)
        edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    else if (flags & NK_EDIT_ALWAYS_INSERT_MODE)
        edit->mode = NK_TEXT_EDIT_MODE_INSERT;

    ret = (edit->active) ? NK_EDIT_ACTIVE: NK_EDIT_INACTIVE;
    if (prev_state != edit->active)
        ret |= (edit->active) ? NK_EDIT_ACTIVATED: NK_EDIT_DEACTIVATED;

    /* handle user input */
    if (edit->active && in)
    {
        int shift_mod = in->keyboard.keys[NK_KEY_SHIFT].down;
        const float mouse_x = (in->mouse.pos.x - area.x) + edit->scrollbar.x;
        const float mouse_y = (in->mouse.pos.y - area.y) + edit->scrollbar.y;

        /* mouse click handler */
        is_hovered = (char)nk_input_is_mouse_hovering_rect(in, area);
        if (select_all) {
            nk_textedit_select_all(edit);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            in->mouse.buttons[NK_BUTTON_LEFT].clicked) {
            nk_textedit_click(edit, mouse_x, mouse_y, font, row_height);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            (in->mouse.delta.x != 0.0f || in->mouse.delta.y != 0.0f)) {
            nk_textedit_drag(edit, mouse_x, mouse_y, font, row_height);
            cursor_follow = nk_true;
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_RIGHT].clicked &&
            in->mouse.buttons[NK_BUTTON_RIGHT].down) {
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_LEFT, nk_false, font, row_height);
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_RIGHT, nk_true, font, row_height);
            cursor_follow = nk_true;
        }

        {int i; /* keyboard input */
        int old_mode = edit->mode;
        for (i = 0; i < NK_KEY_MAX; ++i) {
            if (i == NK_KEY_ENTER || i == NK_KEY_TAB) continue; /* special case */
            if (nk_input_is_key_pressed(in, (enum nk_keys)i)) {
                nk_textedit_key(edit, (enum nk_keys)i, shift_mod, font, row_height);
                cursor_follow = nk_true;
            }
        }
        if (old_mode != edit->mode) {
            in->keyboard.text_len = 0;
        }}

        /* text input */
        edit->filter = filter;
        if (in->keyboard.text_len) {
            nk_textedit_text(edit, in->keyboard.text, in->keyboard.text_len);
            cursor_follow = nk_true;
            in->keyboard.text_len = 0;
        }

        /* enter key handler */
        if (nk_input_is_key_pressed(in, NK_KEY_ENTER)) {
            cursor_follow = nk_true;
            if (flags & NK_EDIT_CTRL_ENTER_NEWLINE && shift_mod)
                nk_textedit_text(edit, "\n", 1);
            else if (flags & NK_EDIT_SIG_ENTER)
                ret |= NK_EDIT_COMMITED;
            else nk_textedit_text(edit, "\n", 1);
        }

        /* cut & copy handler */
        {int copy= nk_input_is_key_pressed(in, NK_KEY_COPY);
        int cut = nk_input_is_key_pressed(in, NK_KEY_CUT);
        if ((copy || cut) && (flags & NK_EDIT_CLIPBOARD))
        {
            int glyph_len;
            nk_rune unicode;
            const char *text;
            int b = edit->select_start;
            int e = edit->select_end;

            int begin = NK_MIN(b, e);
            int end = NK_MAX(b, e);
            text = nk_str_at_const(&edit->string, begin, &unicode, &glyph_len);
            if (edit->clip.copy)
                edit->clip.copy(edit->clip.userdata, text, end - begin);
            if (cut && !(flags & NK_EDIT_READ_ONLY)){
                nk_textedit_cut(edit);
                cursor_follow = nk_true;
            }
        }}

        /* paste handler */
        {int paste = nk_input_is_key_pressed(in, NK_KEY_PASTE);
        if (paste && (flags & NK_EDIT_CLIPBOARD) && edit->clip.paste) {
            edit->clip.paste(edit->clip.userdata, edit);
            cursor_follow = nk_true;
        }}

        /* tab handler */
        {int tab = nk_input_is_key_pressed(in, NK_KEY_TAB);
        if (tab && (flags & NK_EDIT_ALLOW_TAB)) {
            nk_textedit_text(edit, "    ", 4);
            cursor_follow = nk_true;
        }}
    }

    /* set widget state */
    if (edit->active)
        *state = NK_WIDGET_STATE_ACTIVE;
    else nk_widget_state_reset(state);

    if (is_hovered)
        *state |= NK_WIDGET_STATE_HOVERED;

    /* DRAW EDIT */
    {const char *text = nk_str_get_const(&edit->string);
    int len = nk_str_len_char(&edit->string);

    {/* select background colors/images  */
    const struct nk_style_item *background;
    if (*state & NK_WIDGET_STATE_ACTIVED)
        background = &style->active;
    else if (*state & NK_WIDGET_STATE_HOVER)
        background = &style->hover;
    else background = &style->normal;

    /* draw background frame */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_stroke_rect(out, bounds, style->rounding, style->border, style->border_color);
        nk_fill_rect(out, bounds, style->rounding, background->data.color);
    } else nk_draw_image(out, bounds, &background->data.image, nk_white);}

    area.w = NK_MAX(0, area.w - style->cursor_size);
    if (edit->active)
    {
        int total_lines = 1;
        struct nk_vec2 text_size = nk_vec2(0,0);

        /* text pointer positions */
        const char *cursor_ptr = 0;
        const char *select_begin_ptr = 0;
        const char *select_end_ptr = 0;

        /* 2D pixel positions */
        struct nk_vec2 cursor_pos = nk_vec2(0,0);
        struct nk_vec2 selection_offset_start = nk_vec2(0,0);
        struct nk_vec2 selection_offset_end = nk_vec2(0,0);

        int selection_begin = NK_MIN(edit->select_start, edit->select_end);
        int selection_end = NK_MAX(edit->select_start, edit->select_end);

        /* calculate total line count + total space + cursor/selection position */
        float line_width = 0.0f;
        if (text && len)
        {
            /* utf8 encoding */
            float glyph_width;
            int glyph_len = 0;
            nk_rune unicode = 0;
            int text_len = 0;
            int glyphs = 0;
            int row_begin = 0;

            glyph_len = nk_utf_decode(text, &unicode, len);
            glyph_width = font->width(font->userdata, font->height, text, glyph_len);
            line_width = 0;

            /* iterate all lines */
            while ((text_len < len) && glyph_len)
            {
                /* set cursor 2D position and line */
                if (!cursor_ptr && glyphs == edit->cursor)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    cursor_pos.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    cursor_pos.x = row_size.x;
                    cursor_ptr = text + text_len;
                }

                /* set start selection 2D position and line */
                if (!select_begin_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_begin)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_start.y = (float)(NK_MAX(total_lines-1,0)) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_start.x = row_size.x;
                    select_begin_ptr = text + text_len;
                }

                /* set end selection 2D position and line */
                if (!select_end_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_end)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_end.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_end.x = row_size.x;
                    select_end_ptr = text + text_len;
                }
                if (unicode == '\n') {
                    text_size.x = NK_MAX(text_size.x, line_width);
                    total_lines++;
                    line_width = 0;
                    text_len++;
                    glyphs++;
                    row_begin = text_len;
                    glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                    glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
                    continue;
                }

                glyphs++;
                text_len += glyph_len;
                line_width += (float)glyph_width;

                glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                glyph_width = font->width(font->userdata, font->height,
                    text+text_len, glyph_len);
                continue;
            }
            text_size.y = (float)total_lines * row_height;

            /* handle case when cursor is at end of text buffer */
            if (!cursor_ptr && edit->cursor == edit->string.len) {
                cursor_pos.x = line_width;
                cursor_pos.y = text_size.y - row_height;
            }
        }
        {
            /* scrollbar */
            if (cursor_follow)
            {
                /* update scrollbar to follow cursor */
                if (!(flags & NK_EDIT_NO_HORIZONTAL_SCROLL)) {
                    /* horizontal scroll */
                    const float scroll_increment = area.w * 0.25f;
                    if (cursor_pos.x < edit->scrollbar.x)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, cursor_pos.x - scroll_increment);
                    if (cursor_pos.x >= edit->scrollbar.x + area.w)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, edit->scrollbar.x + scroll_increment);
                } else edit->scrollbar.x = 0;

                if (flags & NK_EDIT_MULTILINE) {
                    /* vertical scroll */
                    if (cursor_pos.y < edit->scrollbar.y)
                        edit->scrollbar.y = NK_MAX(0.0f, cursor_pos.y - row_height);
                    if (cursor_pos.y >= edit->scrollbar.y + area.h)
                        edit->scrollbar.y = edit->scrollbar.y + row_height;
                } else edit->scrollbar.y = 0;
            }

            /* scrollbar widget */
            if (flags & NK_EDIT_MULTILINE)
            {
                nk_flags ws;
                struct nk_rect scroll;
                float scroll_target;
                float scroll_offset;
                float scroll_step;
                float scroll_inc;

                scroll = area;
                scroll.x = (bounds.x + bounds.w - style->border) - style->scrollbar_size.x;
                scroll.w = style->scrollbar_size.x;

                scroll_offset = edit->scrollbar.y;
                scroll_step = scroll.h * 0.10f;
                scroll_inc = scroll.h * 0.01f;
                scroll_target = text_size.y;
                edit->scrollbar.y = nk_do_scrollbarv(&ws, out, scroll, 0,
                        scroll_offset, scroll_target, scroll_step, scroll_inc,
                        &style->scrollbar, in, font);
            }
        }

        /* draw text */
        {struct nk_color background_color;
        struct nk_color text_color;
        struct nk_color sel_background_color;
        struct nk_color sel_text_color;
        struct nk_color cursor_color;
        struct nk_color cursor_text_color;
        const struct nk_style_item *background;
        nk_push_scissor(out, clip);

        /* select correct colors to draw */
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_color = style->cursor_hover;
            cursor_text_color = style->cursor_text_hover;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_text_color = style->cursor_text_hover;
            cursor_color = style->cursor_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
            sel_text_color = style->selected_text_normal;
            sel_background_color = style->selected_normal;
            cursor_color = style->cursor_normal;
            cursor_text_color = style->cursor_text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;


        if (edit->select_start == edit->select_end) {
            /* no selection so just draw the complete text */
            const char *begin = nk_str_get_const(&edit->string);
            int l = nk_str_len_char(&edit->string);
            nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
                background_color, text_color, nk_false);
        } else {
            /* edit has selection so draw 1-3 text chunks */
            if (edit->select_start != edit->select_end && selection_begin > 0){
                /* draw unselected text before selection */
                const char *begin = nk_str_get_const(&edit->string);
                NK_ASSERT(select_begin_ptr);
                nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                    area.y - edit->scrollbar.y, 0, begin, (int)(select_begin_ptr - begin),
                    row_height, font, background_color, text_color, nk_false);
            }
            if (edit->select_start != edit->select_end) {
                /* draw selected text */
                NK_ASSERT(select_begin_ptr);
                if (!select_end_ptr) {
                    const char *begin = nk_str_get_const(&edit->string);
                    select_end_ptr = begin + nk_str_len_char(&edit->string);
                }
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_start.y - edit->scrollbar.y,
                    selection_offset_start.x,
                    select_begin_ptr, (int)(select_end_ptr - select_begin_ptr),
                    row_height, font, sel_background_color, sel_text_color, nk_true);
            }
            if ((edit->select_start != edit->select_end &&
                selection_end < edit->string.len))
            {
                /* draw unselected text after selected text */
                const char *begin = select_end_ptr;
                const char *end = nk_str_get_const(&edit->string) +
                                    nk_str_len_char(&edit->string);
                NK_ASSERT(select_end_ptr);
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_end.y - edit->scrollbar.y,
                    selection_offset_end.x,
                    begin, (int)(end - begin), row_height, font,
                    background_color, text_color, nk_true);
            }
        }

        /* cursor */
        if (edit->select_start == edit->select_end)
        {
            if (edit->cursor >= nk_str_len(&edit->string) ||
                (cursor_ptr && *cursor_ptr == '\n')) {
                /* draw cursor at end of line */
                struct nk_rect cursor;
                cursor.w = style->cursor_size;
                cursor.h = font->height;
                cursor.x = area.x + cursor_pos.x - edit->scrollbar.x;
                cursor.y = area.y + cursor_pos.y + row_height/2.0f - cursor.h/2.0f;
                cursor.y -= edit->scrollbar.y;
                nk_fill_rect(out, cursor, 0, cursor_color);
            } else {
                /* draw cursor inside text */
                int glyph_len;
                struct nk_rect label;
                struct nk_text txt;

                nk_rune unicode;
                NK_ASSERT(cursor_ptr);
                glyph_len = nk_utf_decode(cursor_ptr, &unicode, 4);

                label.x = area.x + cursor_pos.x - edit->scrollbar.x;
                label.y = area.y + cursor_pos.y - edit->scrollbar.y;
                label.w = font->width(font->userdata, font->height, cursor_ptr, glyph_len);
                label.h = row_height;

                txt.padding = nk_vec2(0,0);
                txt.background = cursor_color;;
                txt.text = cursor_text_color;
                nk_fill_rect(out, label, 0, cursor_color);
                nk_widget_text(out, label, cursor_ptr, glyph_len, &txt, NK_TEXT_LEFT, font);
            }
        }}
    } else {
        /* not active so just draw text */
        int l = nk_str_len_char(&edit->string);
        const char *begin = nk_str_get_const(&edit->string);

        const struct nk_style_item *background;
        struct nk_color background_color;
        struct nk_color text_color;
        nk_push_scissor(out, clip);
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;
        nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
            area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
            background_color, text_color, nk_false);
    }
    nk_push_scissor(out, old_clip);}
    return ret;
}